

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O3

void * xmlFileOpenW(char *filename)

{
  int iVar1;
  long lVar2;
  FILE *pFVar3;
  
  if ((*filename != '-') || (pFVar3 = _stdout, filename[1] != '\0')) {
    iVar1 = xmlStrncasecmp((xmlChar *)filename,(xmlChar *)"file://localhost/",0x11);
    if (iVar1 == 0) {
      lVar2 = 0x10;
    }
    else {
      iVar1 = xmlStrncasecmp((xmlChar *)filename,(xmlChar *)"file:///",8);
      lVar2 = 7;
      if (iVar1 != 0) {
        lVar2 = 0;
      }
    }
    pFVar3 = fopen64(filename + lVar2,"wb");
    if (pFVar3 == (FILE *)0x0) {
      __xmlIOErr(8,0,filename + lVar2);
      pFVar3 = (FILE *)0x0;
    }
  }
  return pFVar3;
}

Assistant:

static void *
xmlFileOpenW (const char *filename) {
    const char *path = NULL;
    FILE *fd;

    if (!strcmp(filename, "-")) {
	fd = stdout;
	return((void *) fd);
    }

    if (!xmlStrncasecmp(BAD_CAST filename, BAD_CAST "file://localhost/", 17))
#if defined (_WIN32) || defined (__DJGPP__) && !defined(__CYGWIN__)
	path = &filename[17];
#else
	path = &filename[16];
#endif
    else if (!xmlStrncasecmp(BAD_CAST filename, BAD_CAST "file:///", 8)) {
#if defined (_WIN32) || defined (__DJGPP__) && !defined(__CYGWIN__)
	path = &filename[8];
#else
	path = &filename[7];
#endif
    }